

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
::ConvertFromStruct(JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
                    *this,vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
                          *list)

{
  bool bVar1;
  ElementsDecodeRawTransactionTxIn *in_RDI;
  ElementsDecodeRawTransactionTxIn object;
  ElementsDecodeRawTransactionTxInStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
  *__range3;
  ElementsDecodeRawTransactionTxInStruct *in_stack_fffffffffffffcf8;
  value_type *in_stack_fffffffffffffd08;
  vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
  *in_stack_fffffffffffffd10;
  ElementsDecodeRawTransactionTxIn *in_stack_fffffffffffffd60;
  __normal_iterator<const_ElementsDecodeRawTransactionTxInStruct_*,_std::vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (ElementsDecodeRawTransactionTxInStruct *)
       ::std::
       vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
       ::begin(in_stack_fffffffffffffcf8);
  ::std::
  vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
  ::end((vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
         *)in_stack_fffffffffffffcf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ElementsDecodeRawTransactionTxInStruct_*,_std::vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_ElementsDecodeRawTransactionTxInStruct_*,_std::vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>_>
                        *)in_stack_fffffffffffffcf8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_ElementsDecodeRawTransactionTxInStruct_*,_std::vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>_>
    ::operator*(local_20);
    in_stack_fffffffffffffcf8 = (ElementsDecodeRawTransactionTxInStruct *)&stack0xfffffffffffffd18;
    cfd::api::json::ElementsDecodeRawTransactionTxIn::ElementsDecodeRawTransactionTxIn
              (in_stack_fffffffffffffd60);
    cfd::api::json::ElementsDecodeRawTransactionTxIn::ConvertFromStruct
              (in_RDI,in_stack_fffffffffffffcf8);
    ::std::
    vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
    ::push_back(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    cfd::api::json::ElementsDecodeRawTransactionTxIn::~ElementsDecodeRawTransactionTxIn(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_ElementsDecodeRawTransactionTxInStruct_*,_std::vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }